

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_0::ValidateImageLod(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  spv_result_t sVar4;
  DiagnosticStream *pDVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type sVar6;
  spv_const_context psVar7;
  uint local_132c;
  undefined1 local_1308 [4];
  spv_result_t result_1;
  uint local_112c;
  undefined1 local_1128 [4];
  uint32_t mask;
  uint32_t local_f50;
  uint local_f4c;
  uint32_t actual_coord_size;
  uint32_t min_coord_size;
  DiagnosticStream local_d70;
  uint32_t local_b94;
  char *pcStack_b90;
  uint32_t coord_type;
  DiagnosticStream local_b88;
  uint32_t local_9ac;
  undefined1 local_9a8 [4];
  uint32_t texel_component_type;
  undefined4 local_7cc;
  undefined1 local_7c8 [4];
  spv_result_t result;
  undefined1 local_5f0 [8];
  ImageTypeInfo info;
  char *pcStack_3f0;
  uint32_t image_type;
  DiagnosticStream local_3e8;
  char *local_210;
  DiagnosticStream local_208;
  spv_result_t local_2c;
  uint32_t local_28;
  spv_result_t error;
  uint32_t actual_result_type;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _actual_result_type = inst;
  inst_local = (Instruction *)_;
  error = Instruction::opcode(inst);
  local_28 = 0;
  local_2c = GetActualResultType((ValidationState_t *)inst_local,_actual_result_type,&local_28);
  __local._4_4_ = local_2c;
  if (local_2c == SPV_SUCCESS) {
    bVar1 = ValidationState_t::IsIntVectorType((ValidationState_t *)inst_local,local_28);
    if ((bVar1) ||
       (bVar1 = ValidationState_t::IsFloatVectorType((ValidationState_t *)inst_local,local_28),
       bVar1)) {
      uVar2 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_28);
      if (uVar2 == 4) {
        uVar2 = ValidationState_t::GetOperandTypeId
                          ((ValidationState_t *)inst_local,_actual_result_type,2);
        OVar3 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,uVar2);
        if (OVar3 == OpTypeSampledImage) {
          ImageTypeInfo::ImageTypeInfo((ImageTypeInfo *)local_5f0);
          bVar1 = GetImageTypeInfo((ValidationState_t *)inst_local,uVar2,(ImageTypeInfo *)local_5f0)
          ;
          if (bVar1) {
            bVar1 = IsProj(error);
            if (bVar1) {
              sVar4 = ValidateImageProj((ValidationState_t *)inst_local,_actual_result_type,
                                        (ImageTypeInfo *)local_5f0);
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
              local_7cc = 0;
            }
            if (info.depth == 0) {
              OVar3 = ValidationState_t::GetIdOpcode
                                ((ValidationState_t *)inst_local,local_5f0._0_4_);
              if ((OVar3 == OpTypeVoid) ||
                 (local_9ac = ValidationState_t::GetComponentType
                                        ((ValidationState_t *)inst_local,local_28),
                 local_9ac == local_5f0._0_4_)) {
                local_b94 = ValidationState_t::GetOperandTypeId
                                      ((ValidationState_t *)inst_local,_actual_result_type,3);
                if (((error == 0x58) || (error == 0x132)) &&
                   (bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,Kernel)
                   , bVar1)) {
                  bVar1 = ValidationState_t::IsFloatScalarOrVectorType
                                    ((ValidationState_t *)inst_local,local_b94);
                  if ((!bVar1) &&
                     (bVar1 = ValidationState_t::IsIntScalarOrVectorType
                                        ((ValidationState_t *)inst_local,local_b94), !bVar1)) {
                    ValidationState_t::diag
                              (&local_d70,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                               _actual_result_type);
                    pDVar5 = DiagnosticStream::operator<<
                                       (&local_d70,
                                        (char (*) [56])
                                        "Expected Coordinate to be int or float scalar or vector");
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                    DiagnosticStream::~DiagnosticStream(&local_d70);
                    return __local._4_4_;
                  }
                }
                else {
                  bVar1 = ValidationState_t::IsFloatScalarOrVectorType
                                    ((ValidationState_t *)inst_local,local_b94);
                  if (!bVar1) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&actual_coord_size,
                               (ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                               _actual_result_type);
                    pDVar5 = DiagnosticStream::operator<<
                                       ((DiagnosticStream *)&actual_coord_size,
                                        (char (*) [49])
                                        "Expected Coordinate to be float scalar or vector");
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&actual_coord_size);
                    return __local._4_4_;
                  }
                }
                local_f4c = GetMinCoordSize(error,(ImageTypeInfo *)local_5f0);
                local_f50 = ValidationState_t::GetDimension
                                      ((ValidationState_t *)inst_local,local_b94);
                if (local_f50 < local_f4c) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_1128,(ValidationState_t *)inst_local,
                             SPV_ERROR_INVALID_DATA,_actual_result_type);
                  pDVar5 = DiagnosticStream::operator<<
                                     ((DiagnosticStream *)local_1128,
                                      (char (*) [38])"Expected Coordinate to have at least ");
                  pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_f4c);
                  pDVar5 = DiagnosticStream::operator<<
                                     (pDVar5,(char (*) [29])" components, but given only ");
                  pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_f50);
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1128);
                }
                else {
                  this = Instruction::words(_actual_result_type);
                  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
                  if (sVar6 < 6) {
                    local_132c = 0;
                  }
                  else {
                    local_132c = Instruction::word(_actual_result_type,5);
                  }
                  local_112c = local_132c;
                  if ((local_132c & 8) != 0) {
                    psVar7 = ValidationState_t::context((ValidationState_t *)inst_local);
                    bVar1 = spvIsOpenCLEnv(psVar7->target_env);
                    if ((bVar1) && (error == 0x58)) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_1308,(ValidationState_t *)inst_local,
                                 SPV_ERROR_INVALID_DATA,_actual_result_type);
                      pDVar5 = DiagnosticStream::operator<<
                                         ((DiagnosticStream *)local_1308,
                                          (char (*) [39])"ConstOffset image operand not allowed ");
                      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [27])0x62b8fd);
                      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1308);
                      return __local._4_4_;
                    }
                  }
                  __local._4_4_ =
                       ValidateImageOperands
                                 ((ValidationState_t *)inst_local,_actual_result_type,
                                  (ImageTypeInfo *)local_5f0,6);
                  if (__local._4_4_ == SPV_SUCCESS) {
                    __local._4_4_ = SPV_SUCCESS;
                  }
                }
              }
              else {
                ValidationState_t::diag
                          (&local_b88,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                           _actual_result_type);
                pDVar5 = DiagnosticStream::operator<<
                                   (&local_b88,
                                    (char (*) [49])
                                    "Expected Image \'Sampled Type\' to be the same as ");
                pcStack_b90 = GetActualResultTypeStr(error);
                pDVar5 = DiagnosticStream::operator<<(pDVar5,&stack0xfffffffffffff470);
                pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [12])0x62da1d);
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                DiagnosticStream::~DiagnosticStream(&local_b88);
              }
            }
            else {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_9a8,(ValidationState_t *)inst_local,
                         SPV_ERROR_INVALID_DATA,_actual_result_type);
              pDVar5 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)local_9a8,
                                  (char (*) [52])
                                  "Sampling operation is invalid for multisample image");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_9a8);
            }
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_7c8,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,_actual_result_type);
            pDVar5 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)local_7c8,
                                (char (*) [30])"Corrupt image type definition");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_7c8);
          }
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&info.format,(ValidationState_t *)inst_local,
                     SPV_ERROR_INVALID_DATA,_actual_result_type);
          pDVar5 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&info.format,
                              (char (*) [56])
                              "Expected Sampled Image to be of type OpTypeSampledImage");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&info.format);
        }
      }
      else {
        ValidationState_t::diag
                  (&local_3e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                   _actual_result_type);
        pDVar5 = DiagnosticStream::operator<<(&local_3e8,(char (*) [10])"Expected ");
        pcStack_3f0 = GetActualResultTypeStr(error);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,&stack0xfffffffffffffc10);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [22])" to have 4 components");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream(&local_3e8);
      }
    }
    else {
      ValidationState_t::diag
                (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 _actual_result_type);
      pDVar5 = DiagnosticStream::operator<<(&local_208,(char (*) [10])"Expected ");
      local_210 = GetActualResultTypeStr(error);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_210);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [32])" to be int or float vector type")
      ;
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream(&local_208);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateImageLod(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  uint32_t actual_result_type = 0;
  if (spv_result_t error = GetActualResultType(_, inst, &actual_result_type)) {
    return error;
  }

  if (!_.IsIntVectorType(actual_result_type) &&
      !_.IsFloatVectorType(actual_result_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected " << GetActualResultTypeStr(opcode)
           << " to be int or float vector type";
  }

  if (_.GetDimension(actual_result_type) != 4) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected " << GetActualResultTypeStr(opcode)
           << " to have 4 components";
  }

  const uint32_t image_type = _.GetOperandTypeId(inst, 2);
  if (_.GetIdOpcode(image_type) != spv::Op::OpTypeSampledImage) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Sampled Image to be of type OpTypeSampledImage";
  }

  ImageTypeInfo info;
  if (!GetImageTypeInfo(_, image_type, &info)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Corrupt image type definition";
  }

  if (IsProj(opcode)) {
    if (spv_result_t result = ValidateImageProj(_, inst, info)) return result;
  }

  if (info.multisampled) {
    // When using image operands, the Sample image operand is required if and
    // only if the image is multisampled (MS=1). The Sample image operand is
    // only allowed for fetch, read, and write.
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Sampling operation is invalid for multisample image";
  }

  if (_.GetIdOpcode(info.sampled_type) != spv::Op::OpTypeVoid) {
    const uint32_t texel_component_type =
        _.GetComponentType(actual_result_type);
    if (texel_component_type != info.sampled_type) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image 'Sampled Type' to be the same as "
             << GetActualResultTypeStr(opcode) << " components";
    }
  }

  const uint32_t coord_type = _.GetOperandTypeId(inst, 3);
  if ((opcode == spv::Op::OpImageSampleExplicitLod ||
       opcode == spv::Op::OpImageSparseSampleExplicitLod) &&
      _.HasCapability(spv::Capability::Kernel)) {
    if (!_.IsFloatScalarOrVectorType(coord_type) &&
        !_.IsIntScalarOrVectorType(coord_type)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Coordinate to be int or float scalar or vector";
    }
  } else {
    if (!_.IsFloatScalarOrVectorType(coord_type)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Coordinate to be float scalar or vector";
    }
  }

  const uint32_t min_coord_size = GetMinCoordSize(opcode, info);
  const uint32_t actual_coord_size = _.GetDimension(coord_type);
  if (min_coord_size > actual_coord_size) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Coordinate to have at least " << min_coord_size
           << " components, but given only " << actual_coord_size;
  }

  const uint32_t mask = inst->words().size() <= 5 ? 0 : inst->word(5);

  if (mask & uint32_t(spv::ImageOperandsMask::ConstOffset)) {
    if (spvIsOpenCLEnv(_.context()->target_env)) {
      if (opcode == spv::Op::OpImageSampleExplicitLod) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "ConstOffset image operand not allowed "
               << "in the OpenCL environment.";
      }
    }
  }

  if (spv_result_t result =
          ValidateImageOperands(_, inst, info, /* word_index = */ 6))
    return result;

  return SPV_SUCCESS;
}